

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subprocess.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Subprocess::Start
          (Subprocess *this,string *program,SearchMode search_mode)

{
  char *__s;
  undefined8 __buf;
  int iVar1;
  __pid_t _Var2;
  size_t sVar3;
  int *piVar4;
  string_view str;
  int stdout_pipe [2];
  int stdin_pipe [2];
  char *argv [2];
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  undefined1 local_48 [16];
  LogMessage local_38;
  char *local_28;
  
  iVar1 = pipe(&local_50);
  if (iVar1 == -1) {
    Start((Subprocess *)local_48);
  }
  else {
    iVar1 = pipe(&local_58);
    if (iVar1 != -1) {
      __s = (program->_M_dataplus)._M_p;
      sVar3 = strlen(__s);
      local_48._0_8_ = malloc(sVar3 + 1);
      if ((char *)local_48._0_8_ != (char *)0x0) {
        strcpy((char *)local_48._0_8_,__s);
      }
      local_48._8_8_ = 0;
      _Var2 = fork();
      this->child_pid_ = _Var2;
      if (_Var2 == -1) {
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&local_38,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/subprocess.cc"
                   ,0x13c);
        str._M_str = "fork: ";
        str._M_len = 6;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_38,str);
        piVar4 = __errno_location();
        local_28 = strerror(*piVar4);
        absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(&local_38,&local_28);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                  ((LogMessageFatal *)&local_38);
      }
      if (_Var2 != 0) {
        free((void *)local_48._0_8_);
        close(local_50);
        close(local_54);
        this->child_stdin_ = local_4c;
        this->child_stdout_ = local_58;
        return;
      }
      goto LAB_00e6467c;
    }
  }
  Start((Subprocess *)local_48);
LAB_00e6467c:
  dup2(local_50,0);
  dup2(local_54,1);
  close(local_50);
  close(local_4c);
  close(local_58);
  close(local_54);
  if (search_mode == EXACT_NAME) {
    execv((char *)local_48._0_8_,(char **)local_48);
  }
  else if (search_mode == SEARCH_PATH) {
    execvp((char *)local_48._0_8_,(char **)local_48);
  }
  __buf = local_48._0_8_;
  sVar3 = strlen((char *)local_48._0_8_);
  write(2,(void *)__buf,sVar3);
  write(2,
        ": program not found or is not executable\nPlease specify a program using absolute path or make sure the program is available in your PATH system variable\n"
        ,0x99);
  _exit(1);
}

Assistant:

void Subprocess::Start(const std::string& program, SearchMode search_mode) {
  // Note that we assume that there are no other threads, thus we don't have to
  // do crazy stuff like using socket pairs or avoiding libc locks.

  // [0] is read end, [1] is write end.
  int stdin_pipe[2];
  int stdout_pipe[2];

  ABSL_CHECK(pipe(stdin_pipe) != -1);
  ABSL_CHECK(pipe(stdout_pipe) != -1);

  char* argv[2] = {portable_strdup(program.c_str()), nullptr};

  child_pid_ = fork();
  if (child_pid_ == -1) {
    ABSL_LOG(FATAL) << "fork: " << strerror(errno);
  } else if (child_pid_ == 0) {
    // We are the child.
    dup2(stdin_pipe[0], STDIN_FILENO);
    dup2(stdout_pipe[1], STDOUT_FILENO);

    close(stdin_pipe[0]);
    close(stdin_pipe[1]);
    close(stdout_pipe[0]);
    close(stdout_pipe[1]);

    switch (search_mode) {
      case SEARCH_PATH:
        execvp(argv[0], argv);
        break;
      case EXACT_NAME:
        execv(argv[0], argv);
        break;
    }

    // Write directly to STDERR_FILENO to avoid stdio code paths that may do
    // stuff that is unsafe here.
    int ignored;
    ignored = write(STDERR_FILENO, argv[0], strlen(argv[0]));
    const char* message =
        ": program not found or is not executable\n"
        "Please specify a program using absolute path or make sure "
        "the program is available in your PATH system variable\n";
    ignored = write(STDERR_FILENO, message, strlen(message));
    (void)ignored;

    // Must use _exit() rather than exit() to avoid flushing output buffers
    // that will also be flushed by the parent.
    _exit(1);
  } else {
    free(argv[0]);

    close(stdin_pipe[0]);
    close(stdout_pipe[1]);

    child_stdin_ = stdin_pipe[1];
    child_stdout_ = stdout_pipe[0];
  }
}